

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
PhaseBotsIRCCommand::trigger
          (PhaseBotsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Server *pSVar1;
  string_view sVar2;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  Channel *pCVar3;
  char *pcVar4;
  bool bVar5;
  reference ppSVar6;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  size_t local_188;
  char *local_180;
  size_t local_178;
  char *local_170;
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  char *local_d0;
  Server **server;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range1;
  size_t local_98;
  char *local_90;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_70 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_58;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  char *local_48;
  long local_40;
  Channel *chan;
  IRC_Bot *source_local;
  PhaseBotsIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (PhaseBotsIRCCommand *)nick._M_len;
  pcVar7 = channel._M_str;
  servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)channel._M_len;
  local_48 = pcVar7;
  chan = (Channel *)source;
  source_local = (IRC_Bot *)this;
  nick_local._M_str = (char *)servers;
  local_40 = Jupiter::IRC::Client::getChannel(source,servers,pcVar7);
  if (local_40 != 0) {
    RenX::getCore();
    Jupiter::IRC::Client::Channel::getType();
    RenX::Core::getServers((int)local_70);
    local_58 = local_70;
    bVar5 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::empty(local_58);
    pcVar4 = nick_local._M_str;
    pCVar3 = chan;
    this_00 = local_58;
    if (bVar5) {
      bVar8 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_98 = bVar8._M_len;
      local_90 = bVar8._M_str;
      Jupiter::IRC::Client::sendMessage(pCVar3,pcVar4,pcVar7,local_98,local_90);
    }
    else {
      __end1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_58);
      server = (Server **)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00)
      ;
      while (bVar5 = __gnu_cxx::
                     operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                               (&__end1,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                         *)&server), ((bVar5 ^ 0xffU) & 1) != 0) {
        ppSVar6 = __gnu_cxx::
                  __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                  ::operator*(&__end1);
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
        sVar2 = parameters;
        if (bVar5) {
          bVar5 = togglePhasing(*ppSVar6);
          if (bVar5) {
            pSVar1 = *ppSVar6;
            bVar8 = sv("Bot phasing has been enabled.",0x1d);
            local_d8 = bVar8._M_len;
            local_d0 = bVar8._M_str;
            RenX::Server::sendMessage(pSVar1,local_d8,local_d0);
          }
          else {
            pSVar1 = *ppSVar6;
            bVar8 = sv("Bot phasing has been disabled.",0x1e);
            local_e8 = bVar8._M_len;
            local_e0 = bVar8._M_str;
            RenX::Server::sendMessage(pSVar1,local_e8,local_e0);
          }
        }
        else {
          bVar8 = sv("true",4);
          bVar5 = jessilib::equalsi<char,char>(sVar2,bVar8);
          sVar2 = parameters;
          if (!bVar5) {
            bVar8 = sv("on",2);
            bVar5 = jessilib::equalsi<char,char>(sVar2,bVar8);
            sVar2 = parameters;
            if (!bVar5) {
              bVar8 = sv("start",5);
              bVar5 = jessilib::equalsi<char,char>(sVar2,bVar8);
              sVar2 = parameters;
              if (!bVar5) {
                bVar8 = sv("1",1);
                bVar5 = jessilib::equalsi<char,char>(sVar2,bVar8);
                if (!bVar5) {
                  togglePhasing(*ppSVar6,false);
                  pSVar1 = *ppSVar6;
                  bVar8 = sv("Bot phasing has been disabled.",0x1e);
                  local_188 = bVar8._M_len;
                  local_180 = bVar8._M_str;
                  RenX::Server::sendMessage(pSVar1,local_188,local_180);
                  goto LAB_00154393;
                }
              }
            }
          }
          togglePhasing(*ppSVar6,true);
          pSVar1 = *ppSVar6;
          bVar8 = sv("Bot phasing has been enabled.",0x1d);
          local_178 = bVar8._M_len;
          local_170 = bVar8._M_str;
          RenX::Server::sendMessage(pSVar1,local_178,local_170);
        }
LAB_00154393:
        __gnu_cxx::
        __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
        ::operator++(&__end1);
      }
    }
    std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_70);
  }
  return;
}

Assistant:

void PhaseBotsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	for (const auto& server : servers) {
		if (parameters.empty()) {
			if (togglePhasing(server)) {
				server->sendMessage("Bot phasing has been enabled."sv);
			}
			else {
				server->sendMessage("Bot phasing has been disabled."sv);
			}
		}
		else if (jessilib::equalsi(parameters, "true"sv) || jessilib::equalsi(parameters, "on"sv)
			|| jessilib::equalsi(parameters, "start"sv) || jessilib::equalsi(parameters, "1"sv)) {
			togglePhasing(server, true);
			server->sendMessage("Bot phasing has been enabled."sv);
		}
		else {
			togglePhasing(server, false);
			server->sendMessage("Bot phasing has been disabled."sv);
		}
	}
}